

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void gl4cts::GLSL420Pack::Utils::prepareBlockVariableStrings
               (SHADER_STAGES in_stage,VARIABLE_STORAGE in_storage,qualifierSet *in_qualifiers,
               GLchar *in_type_name,GLchar *in_variable_name,GLchar *in_block_name,
               string *out_definition,string *out_reference)

{
  VARIABLE_FLAVOUR VVar1;
  GLchar *variable_name;
  _Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  local_88;
  string local_70;
  string local_50;
  
  variable_name = in_variable_name;
  VVar1 = getVariableFlavour(in_stage,in_storage,in_qualifiers);
  prepareQualifiersSet((qualifierSet *)&local_88,in_qualifiers,in_stage,in_storage);
  getVariableName_abi_cxx11_
            (&local_70,(Utils *)(ulong)in_stage,in_storage,(VARIABLE_STORAGE)in_variable_name,
             variable_name);
  getBlockVariableDefinition_abi_cxx11_
            (&local_50,(Utils *)&local_88,(qualifierSet *)in_type_name,local_70._M_dataplus._M_p,
             variable_name);
  std::__cxx11::string::operator=((string *)out_definition,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  getBlockVariableReference_abi_cxx11_
            (&local_50,(Utils *)(ulong)VVar1,(VARIABLE_FLAVOUR)local_70._M_dataplus._M_p,
             in_block_name,variable_name);
  std::__cxx11::string::operator=((string *)out_reference,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::
  _Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::~_Vector_base(&local_88);
  return;
}

Assistant:

void Utils::prepareBlockVariableStrings(Utils::SHADER_STAGES in_stage, Utils::VARIABLE_STORAGE in_storage,
										const Utils::qualifierSet& in_qualifiers, const glw::GLchar* in_type_name,
										const glw::GLchar* in_variable_name, const glw::GLchar* in_block_name,
										std::string& out_definition, std::string& out_reference)
{
	VARIABLE_FLAVOUR	flavour	= getVariableFlavour(in_stage, in_storage, in_qualifiers);
	const qualifierSet& qualifiers = prepareQualifiersSet(in_qualifiers, in_stage, in_storage);
	const std::string&  name	   = getVariableName(in_stage, in_storage, in_variable_name);

	out_definition = getBlockVariableDefinition(qualifiers, in_type_name, name.c_str());
	out_reference  = getBlockVariableReference(flavour, name.c_str(), in_block_name);
}